

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::array<unsigned_int,3ul>>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
          *result)

{
  bool bVar1;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  array<unsigned_int,_3UL> value_1;
  char nc;
  char c;
  undefined1 local_34 [8];
  array<unsigned_int,_3UL> value;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
  *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._M_elems._4_8_ = result;
  ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
  clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,(uint3 *)local_34);
    if (bVar1) {
      ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ::push_back((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)value._M_elems._4_8_,(value_type *)local_34);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1._M_elems + 6));
        if (!bVar1) {
          return false;
        }
        if (value_1._M_elems[1]._2_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)value_1._M_elems + 5));
          if (!bVar1) {
            return false;
          }
          if (value_1._M_elems[1]._1_1_ == end_symbol) break;
        }
        if (value_1._M_elems[1]._2_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,(uint3 *)local_68);
        if (!bVar1) break;
        ::std::
        vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
        push_back((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)value._M_elems._4_8_,(value_type *)local_68);
      }
      bVar1 = ::std::
              vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
              ::empty((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                       *)value._M_elems._4_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_88,"Empty array.\n",&local_89);
        PushError(this,&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(value_1._M_elems + 2),"Not starting with the value of requested type.\n"
                 ,(allocator *)((long)value_1._M_elems + 7));
      PushError(this,(string *)(value_1._M_elems + 2));
      ::std::__cxx11::string::~string((string *)(value_1._M_elems + 2));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1._M_elems + 7));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}